

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_Encode_Test::TestBody
          (EncodeDecodeTest_Encode_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  AlphaNum *a;
  string *filename;
  char *in_R9;
  string_view path;
  string args;
  string local_c8;
  undefined1 local_a8 [48];
  string golden_path;
  AssertionResult gtest_ar_;
  AlphaNum local_48;
  
  TestTempDir_abi_cxx11_();
  local_a8._0_8_ = args._M_string_length;
  local_a8._8_8_ = args._M_dataplus._M_p;
  local_48.piece_ = absl::lts_20250127::NullSafeStringView("/golden_message");
  a = &local_48;
  absl::lts_20250127::StrCat_abi_cxx11_(&golden_path,(lts_20250127 *)local_a8,a,a);
  std::__cxx11::string::~string((string *)&args);
  WriteGoldenMessage(&golden_path);
  filename = (string *)0x48;
  path._M_str = (char *)a;
  path._M_len = (size_t)"google/protobuf/testdata/text_format_unittest_data_oneof_implemented.txt";
  TestUtil::GetTestDataPath_abi_cxx11_((string *)local_a8,(TestUtil *)0x48,path);
  EncodeDecodeTest::RedirectStdinFromFile((EncodeDecodeTest *)local_a8,filename);
  std::__cxx11::string::~string((string *)local_a8);
  args._M_dataplus._M_p = (pointer)&args.field_2;
  args._M_string_length = 0;
  args.field_2._M_local_buf[0] = '\0';
  pPVar2 = testing::
           WithParamInterface<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>
           ::GetParam();
  if (*pPVar2 != DESCRIPTOR_SET_IN) {
    std::__cxx11::string::append((char *)&args);
  }
  local_a8._0_8_ = args._M_string_length;
  local_a8._8_8_ = args._M_dataplus._M_p;
  local_48.piece_ = absl::lts_20250127::NullSafeStringView(" --encode=proto2_unittest.TestAllTypes")
  ;
  absl::lts_20250127::StrCat_abi_cxx11_(&local_c8,(lts_20250127 *)local_a8,&local_48,&local_48);
  bVar1 = EncodeDecodeTest::Run(&this->super_EncodeDecodeTest,&local_c8,true);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = bVar1;
  std::__cxx11::string::~string((string *)&local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)&gtest_ar_,
               (AssertionResult *)
               "Run(absl::StrCat(args, \" --encode=proto2_unittest.TestAllTypes\"))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x11c7,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)local_a8);
    if ((pointer)local_48.piece_._M_len != (pointer)0x0) {
      (**(code **)(((_Alloc_hider *)local_48.piece_._M_len)->_M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  EncodeDecodeTest::ExpectStdoutMatchesBinaryFile(&this->super_EncodeDecodeTest,&golden_path);
  EncodeDecodeTest::ExpectNoErrors(&this->super_EncodeDecodeTest);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::string::~string((string *)&golden_path);
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, Encode) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(TestUtil::GetTestDataPath(
      "google/protobuf/"
      "testdata/text_format_unittest_data_oneof_implemented.txt"));
  std::string args;
  if (GetParam() != DESCRIPTOR_SET_IN) {
    args.append("google/protobuf/unittest.proto");
  }
  EXPECT_TRUE(
      Run(absl::StrCat(args, " --encode=proto2_unittest.TestAllTypes")));
  ExpectStdoutMatchesBinaryFile(golden_path);
  ExpectNoErrors();
}